

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O3

int utest_main(int argc,char **argv)

{
  __time_t _Var1;
  __time_t _Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  void *__ptr;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int result;
  timespec ts;
  long local_88;
  int local_74;
  char *local_70;
  void *local_68;
  char *local_60;
  long local_58;
  char *local_50;
  char *local_48;
  timespec local_40;
  
  iVar3 = isatty(1);
  bVar11 = iVar3 == 0;
  local_50 = "\x1b[31m";
  if (bVar11) {
    local_50 = "";
  }
  local_60 = "\x1b[32m";
  if (bVar11) {
    local_60 = "";
  }
  local_70 = "\x1b[0m";
  if (bVar11) {
    local_70 = "";
  }
  if ((uint)argc < 2) {
    pcVar6 = (char *)0x0;
LAB_0010b71c:
    pcVar8 = local_70;
    if (utest_state.tests_length == 0) {
      lVar5 = 0;
    }
    else {
      lVar9 = 0x10;
      lVar5 = 0;
      uVar10 = 0;
      do {
        iVar3 = utest_should_filter_test
                          (pcVar6,*(char **)((long)&(utest_state.tests)->func + lVar9));
        lVar5 = lVar5 + (ulong)(iVar3 == 0);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar10 < utest_state.tests_length);
    }
    printf("%s[==========]%s Running %lu test cases.\n",local_60,pcVar8,lVar5);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)utest_state.output);
      fprintf((FILE *)utest_state.output,"<testsuites tests=\"%lu\" name=\"All\">\n",lVar5);
      fprintf((FILE *)utest_state.output,"<testsuite name=\"Tests\" tests=\"%lu\">\n",lVar5);
    }
    if (utest_state.tests_length == 0) {
      local_68 = (void *)0x0;
      lVar9 = 0;
      local_88 = 0;
    }
    else {
      lVar4 = 0;
      local_88 = 0;
      lVar9 = 0;
      local_68 = (void *)0x0;
      uVar10 = 0;
      local_48 = pcVar6;
      do {
        local_74 = 0;
        iVar3 = utest_should_filter_test
                          (pcVar6,*(char **)((long)&(utest_state.tests)->name + lVar4));
        if (iVar3 == 0) {
          printf("%s[ RUN      ]%s %s\n",local_60,pcVar8,
                 *(undefined8 *)((long)&(utest_state.tests)->name + lVar4));
          if (utest_state.output != (FILE *)0x0) {
            fprintf((FILE *)utest_state.output,"<testcase name=\"%s\">",
                    *(undefined8 *)((long)&(utest_state.tests)->name + lVar4));
          }
          clock_gettime(0,&local_40);
          _Var1 = local_40.tv_sec;
          local_58 = local_40.tv_nsec;
          (**(code **)((long)&(utest_state.tests)->func + lVar4))
                    (&local_74,*(undefined8 *)((long)&(utest_state.tests)->index + lVar4));
          clock_gettime(0,&local_40);
          lVar7 = local_40.tv_nsec;
          _Var2 = local_40.tv_sec;
          if (utest_state.output != (FILE *)0x0) {
            fwrite("</testcase>\n",0xc,1,(FILE *)utest_state.output);
          }
          pcVar8 = local_70;
          lVar7 = (lVar7 - local_58) + (_Var2 - _Var1) * 1000000000;
          if (local_74 == 0) {
            printf("%s[       OK ]%s %s (%ldns)\n",local_60,local_70,
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar4),lVar7);
            pcVar6 = local_48;
          }
          else {
            local_68 = realloc(local_68,lVar9 * 8 + 8);
            pcVar8 = local_70;
            *(ulong *)((long)local_68 + lVar9 * 8) = uVar10;
            local_88 = local_88 + 1;
            printf("%s[  FAILED  ]%s %s (%ldns)\n",local_50,local_70,
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar4),lVar7);
            lVar9 = lVar9 + 1;
            pcVar6 = local_48;
          }
        }
        uVar10 = uVar10 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar10 < utest_state.tests_length);
    }
    pcVar6 = local_60;
    printf("%s[==========]%s %lu test cases ran.\n",local_60,pcVar8,lVar5);
    printf("%s[  PASSED  ]%s %lu tests.\n",pcVar6,pcVar8,lVar5 - local_88);
    pcVar6 = local_50;
    __ptr = local_68;
    if ((local_88 != 0) &&
       (printf("%s[  FAILED  ]%s %lu tests, listed below:\n",local_50,pcVar8,local_88), lVar9 != 0))
    {
      lVar5 = 0;
      do {
        printf("%s[  FAILED  ]%s %s\n",pcVar6,pcVar8,
               utest_state.tests[*(long *)((long)__ptr + lVar5 * 8)].name);
        lVar5 = lVar5 + 1;
      } while (lVar9 != lVar5);
    }
    if (utest_state.output != (FILE *)0x0) {
      fwrite("</testsuite>\n</testsuites>\n",0x1b,1,(FILE *)utest_state.output);
    }
    iVar3 = (int)local_88;
LAB_0010ba88:
    if (utest_state.tests_length != 0) {
      lVar5 = 0x10;
      uVar10 = 0;
      do {
        free(*(void **)((long)&(utest_state.tests)->func + lVar5));
        uVar10 = uVar10 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar10 < utest_state.tests_length);
    }
    free(__ptr);
    free(utest_state.tests);
    if (utest_state.output != (FILE *)0x0) {
      fclose((FILE *)utest_state.output);
    }
    return iVar3;
  }
  lVar5 = (long)argc;
  lVar9 = 1;
  pcVar6 = (char *)0x0;
LAB_0010b6a4:
  pcVar8 = argv[lVar9];
  lVar4 = 0;
  while (pcVar8[lVar4] == (&DAT_0015f03d)[lVar4]) {
    lVar4 = lVar4 + 1;
    if ((int)lVar4 == 6) {
      puts(
          "utest.h - the single file unit testing solution for C/C++!\nCommand line Options:\n  --help            Show this message and exit.\n  --filter=<filter> Filter the test cases to run (EG. MyTest*.a would run MyTestCase.a but not MyTestCase.b).\n  --output=<output> Output an xunit XML file to the file specified in <output>."
          );
      __ptr = (void *)0x0;
      iVar3 = 0;
      goto LAB_0010ba88;
    }
  }
  lVar4 = 0;
  do {
    if (pcVar8[lVar4] != (&DAT_0015f044)[lVar4]) {
      lVar4 = 0;
      goto LAB_0010b6dd;
    }
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 9);
  pcVar6 = pcVar8 + 9;
  goto LAB_0010b70f;
  while (lVar4 = lVar4 + 1, (int)lVar4 != 9) {
LAB_0010b6dd:
    if (pcVar8[lVar4] != "--output="[lVar4]) goto LAB_0010b70f;
  }
  local_58 = lVar5;
  utest_state.output = (FILE *)fopen(pcVar8 + 9,"w+");
  lVar5 = local_58;
LAB_0010b70f:
  lVar9 = lVar9 + 1;
  if (lVar9 == lVar5) goto LAB_0010b71c;
  goto LAB_0010b6a4;
}

Assistant:

UTEST_WEAK int utest_main(int argc, const char *const argv[]) {
  uint64_t failed = 0;
  size_t index = 0;
  size_t *failed_testcases = 0;
  size_t failed_testcases_length = 0;
  const char *filter = 0;
  uint64_t ran_tests = 0;

  enum colours { RESET, GREEN, RED };

  const int use_colours = UTEST_COLOUR_OUTPUT();
  const char *colours[] = {"\033[0m", "\033[32m", "\033[31m"};
  if (!use_colours) {
    for (index = 0; index < sizeof colours / sizeof colours[0]; index++) {
      colours[index] = "";
    }
  }
  /* loop through all arguments looking for our options */
  for (index = 1; index < UTEST_CAST(size_t, argc); index++) {
    const char help_str[] = "--help";
    const char filter_str[] = "--filter=";
    const char output_str[] = "--output=";

    if (0 == utest_strncmp(argv[index], help_str, strlen(help_str))) {
      printf("utest.h - the single file unit testing solution for C/C++!\n"
             "Command line Options:\n"
             "  --help            Show this message and exit.\n"
             "  --filter=<filter> Filter the test cases to run (EG. MyTest*.a "
             "would run MyTestCase.a but not MyTestCase.b).\n"
             "  --output=<output> Output an xunit XML file to the file "
             "specified in <output>.\n");
      goto cleanup;
    } else if (0 ==
               utest_strncmp(argv[index], filter_str, strlen(filter_str))) {
      /* user wants to filter what test cases run! */
      filter = argv[index] + strlen(filter_str);
    } else if (0 ==
               utest_strncmp(argv[index], output_str, strlen(output_str))) {
      utest_state.output = utest_fopen(argv[index] + strlen(output_str), "w+");
    }
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    ran_tests++;
  }

  printf("%s[==========]%s Running %" UTEST_PRIu64 " test cases.\n",
         colours[GREEN], colours[RESET], UTEST_CAST(uint64_t, ran_tests));

  if (utest_state.output) {
    fprintf(utest_state.output, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
    fprintf(utest_state.output,
            "<testsuites tests=\"%" UTEST_PRIu64 "\" name=\"All\">\n",
            UTEST_CAST(uint64_t, ran_tests));
    fprintf(utest_state.output,
            "<testsuite name=\"Tests\" tests=\"%" UTEST_PRIu64 "\">\n",
            UTEST_CAST(uint64_t, ran_tests));
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    int result = 0;
    int64_t ns = 0;

    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    printf("%s[ RUN      ]%s %s\n", colours[GREEN], colours[RESET],
           utest_state.tests[index].name);

    if (utest_state.output) {
      fprintf(utest_state.output, "<testcase name=\"%s\">",
              utest_state.tests[index].name);
    }

    ns = utest_ns();
    utest_state.tests[index].func(&result, utest_state.tests[index].index);
    ns = utest_ns() - ns;

    if (utest_state.output) {
      fprintf(utest_state.output, "</testcase>\n");
    }

    if (0 != result) {
      const size_t failed_testcase_index = failed_testcases_length++;
      failed_testcases = UTEST_PTR_CAST(
          size_t *, realloc(UTEST_PTR_CAST(void *, failed_testcases),
                            sizeof(size_t) * failed_testcases_length));
      failed_testcases[failed_testcase_index] = index;
      failed++;
      printf("%s[  FAILED  ]%s %s (%" UTEST_PRId64 "ns)\n", colours[RED],
             colours[RESET], utest_state.tests[index].name, ns);
    } else {
      printf("%s[       OK ]%s %s (%" UTEST_PRId64 "ns)\n", colours[GREEN],
             colours[RESET], utest_state.tests[index].name, ns);
    }
  }

  printf("%s[==========]%s %" UTEST_PRIu64 " test cases ran.\n", colours[GREEN],
         colours[RESET], ran_tests);
  printf("%s[  PASSED  ]%s %" UTEST_PRIu64 " tests.\n", colours[GREEN],
         colours[RESET], ran_tests - failed);

  if (0 != failed) {
    printf("%s[  FAILED  ]%s %" UTEST_PRIu64 " tests, listed below:\n",
           colours[RED], colours[RESET], failed);
    for (index = 0; index < failed_testcases_length; index++) {
      printf("%s[  FAILED  ]%s %s\n", colours[RED], colours[RESET],
             utest_state.tests[failed_testcases[index]].name);
    }
  }

  if (utest_state.output) {
    fprintf(utest_state.output, "</testsuite>\n</testsuites>\n");
  }

cleanup:
  for (index = 0; index < utest_state.tests_length; index++) {
    free(UTEST_PTR_CAST(void *, utest_state.tests[index].name));
  }

  free(UTEST_PTR_CAST(void *, failed_testcases));
  free(UTEST_PTR_CAST(void *, utest_state.tests));

  if (utest_state.output) {
    fclose(utest_state.output);
  }

  return UTEST_CAST(int, failed);
}